

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3PagerSharedLock(Pager *pPager)

{
  sqlite3_vfs *psVar1;
  sqlite3_io_methods *psVar2;
  _func_int_sqlite3_vfs_ptr_char_ptr_int *p_Var3;
  undefined1 auVar4 [16];
  int iVar5;
  sqlite3_file *psVar6;
  int iVar7;
  Wal *pWVar8;
  long in_FS_OFFSET;
  bool bVar9;
  undefined1 auVar10 [16];
  int f;
  Pgno nPage;
  int locked;
  int exists;
  undefined1 auStack_44 [5];
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pWVar8 = pPager->pWal;
  if (pWVar8 == (Wal *)0x0) {
    iVar7 = 0;
    iVar5 = iVar7;
    if (pPager->eState != '\0') {
LAB_00139dcd:
      pWVar8 = pPager->pWal;
      if (pWVar8 != (Wal *)0x0) goto LAB_00139d66;
      goto LAB_00139dd9;
    }
    iVar5 = pager_wait_on_lock(pPager,1);
    if (iVar5 == 0) {
      if (1 < pPager->eLock) {
LAB_00139ef4:
        iVar5 = 0x308;
        if ((pPager->readOnly != '\0') || (iVar5 = pagerLockDb(pPager,4), iVar5 != 0))
        goto LAB_00139dfe;
        if (pPager->jfd->pMethods == (sqlite3_io_methods *)0x0) {
          iVar5 = 0;
          if (pPager->journalMode != '\x02') {
            psVar1 = pPager->pVfs;
            exists = 0xaaaaaaaa;
            iVar5 = (*psVar1->xAccess)(psVar1,pPager->zJournal,0,&exists);
            psVar6 = pPager->jfd;
            if ((iVar5 == 0) && (exists != 0)) {
              locked = 0;
              iVar5 = (*psVar1->xOpen)(psVar1,pPager->zJournal,psVar6,0x802,&locked);
              if ((iVar5 == 0) && (iVar5 = 0, (locked & 1U) != 0)) {
                iVar5 = sqlite3CantopenError(0xf4b0);
                psVar6 = pPager->jfd;
                if (psVar6->pMethods != (sqlite3_io_methods *)0x0) {
                  (*psVar6->pMethods->xClose)(psVar6);
                  psVar6->pMethods = (sqlite3_io_methods *)0x0;
                }
              }
              psVar6 = pPager->jfd;
            }
            if (psVar6->pMethods != (sqlite3_io_methods *)0x0) goto LAB_00139f25;
          }
          if (pPager->exclusiveMode == '\0') {
            pagerUnlockDb(pPager,1);
          }
LAB_0013a0d3:
          if (iVar5 == 0) goto LAB_0013a0e8;
        }
        else {
LAB_00139f25:
          iVar5 = pagerSyncHotJournal(pPager);
          if (iVar5 == 0) {
            iVar5 = pager_playback(pPager,(uint)(pPager->tempFile == '\0'));
            pPager->eState = '\0';
            goto LAB_0013a0d3;
          }
        }
        pager_error(pPager,iVar5);
        goto LAB_00139dfe;
      }
      psVar1 = pPager->pVfs;
      exists = 1;
      psVar2 = pPager->jfd->pMethods;
      if ((psVar2 == (sqlite3_io_methods *)0x0) &&
         ((iVar5 = (*psVar1->xAccess)(psVar1,pPager->zJournal,0,&exists), iVar5 != 0 ||
          (exists == 0)))) {
        if (iVar5 != 0) goto LAB_00139dfe;
      }
      else {
        locked = 0;
        iVar5 = (*pPager->fd->pMethods->xCheckReservedLock)(pPager->fd,&locked);
        if (locked == 0 && iVar5 == 0) {
          nPage = 0xaaaaaaaa;
          iVar5 = pagerPagecount(pPager,&nPage);
          bVar9 = true;
          if (iVar5 == 0) {
            if ((psVar2 == (sqlite3_io_methods *)0x0) && (nPage == 0)) {
              if (sqlite3Hooks_0 != (code *)0x0) {
                (*sqlite3Hooks_0)();
              }
              iVar5 = pagerLockDb(pPager,2);
              if (iVar5 == 0) {
                if (psVar1->xDelete != (_func_int_sqlite3_vfs_ptr_char_ptr_int *)0x0) {
                  (*psVar1->xDelete)(psVar1,pPager->zJournal,0);
                }
                if (pPager->exclusiveMode == '\0') {
                  pagerUnlockDb(pPager,1);
                }
              }
              iVar5 = 0;
              if (sqlite3Hooks_1 != (code *)0x0) {
                (*sqlite3Hooks_1)();
              }
            }
            else if (psVar2 == (sqlite3_io_methods *)0x0) {
              f = 0x801;
              iVar5 = (*psVar1->xOpen)(psVar1,pPager->zJournal,pPager->jfd,0x801,&f);
              if (iVar5 == 0xe) {
                bVar9 = false;
                iVar5 = 0;
              }
              else if (iVar5 == 0) goto LAB_00139fd8;
            }
            else {
LAB_00139fd8:
              f = f & 0xffffff00;
              iVar5 = (*pPager->jfd->pMethods->xRead)(pPager->jfd,&f,1,0);
              if (iVar5 == 0x20a) {
                iVar5 = 0;
              }
              if (psVar2 == (sqlite3_io_methods *)0x0) {
                psVar6 = pPager->jfd;
                if (psVar6->pMethods != (sqlite3_io_methods *)0x0) {
                  (*psVar6->pMethods->xClose)(psVar6);
                  psVar6->pMethods = (sqlite3_io_methods *)0x0;
                }
              }
              bVar9 = (char)f == '\0';
            }
          }
        }
        else {
          bVar9 = true;
        }
        if (iVar5 != 0) goto LAB_00139dfe;
        if (!bVar9) goto LAB_00139ef4;
      }
LAB_0013a0e8:
      iVar5 = iVar7;
      if (pPager->tempFile != '\0') goto LAB_00139dcd;
      if (pPager->hasHeldSharedLock == '\0') {
LAB_0013a174:
        exists = 0xaaaaaaaa;
        iVar5 = (*pPager->pVfs->xAccess)(pPager->pVfs,pPager->zWal,0,&exists);
        if (iVar5 == 0) {
          if (exists == 0) {
            if (pPager->journalMode == '\x05') {
              pPager->journalMode = '\0';
            }
          }
          else {
            locked = -0x55555556;
            iVar5 = pagerPagecount(pPager,(Pgno *)&locked);
            if (iVar5 == 0) {
              if (locked == 0) {
                p_Var3 = pPager->pVfs->xDelete;
                if (p_Var3 == (_func_int_sqlite3_vfs_ptr_char_ptr_int *)0x0) {
                  iVar5 = 0;
                }
                else {
                  iVar5 = (*p_Var3)(pPager->pVfs,pPager->zWal,0);
                }
              }
              else {
                iVar5 = sqlite3PagerOpenWal(pPager,(int *)0x0);
              }
            }
          }
        }
        goto LAB_00139dcd;
      }
      stack0xffffffffffffffc0 = &DAT_aaaaaaaaaaaaaaaa;
      _exists = &DAT_aaaaaaaaaaaaaaaa;
      iVar5 = (*pPager->fd->pMethods->xRead)(pPager->fd,&exists,0x10,0x18);
      if (iVar5 == 0) {
LAB_0013a132:
        auVar10[0] = -(pPager->dbFileVers[0] == (char)exists);
        auVar10[1] = -(pPager->dbFileVers[1] == exists._1_1_);
        auVar10[2] = -(pPager->dbFileVers[2] == exists._2_1_);
        auVar10[3] = -(pPager->dbFileVers[3] == exists._3_1_);
        auVar10[4] = -(pPager->dbFileVers[4] == auStack_44[0]);
        auVar10[5] = -(pPager->dbFileVers[5] == auStack_44[1]);
        auVar10[6] = -(pPager->dbFileVers[6] == auStack_44[2]);
        auVar10[7] = -(pPager->dbFileVers[7] == auStack_44[3]);
        auVar10[8] = -(pPager->dbFileVers[8] == auStack_44[4]);
        auVar10[9] = -(pPager->dbFileVers[9] == cStack_3f);
        auVar10[10] = -(pPager->dbFileVers[10] == cStack_3e);
        auVar10[0xb] = -(pPager->dbFileVers[0xb] == cStack_3d);
        auVar10[0xc] = -(pPager->dbFileVers[0xc] == cStack_3c);
        auVar10[0xd] = -(pPager->dbFileVers[0xd] == cStack_3b);
        auVar10[0xe] = -(pPager->dbFileVers[0xe] == cStack_3a);
        auVar10[0xf] = -(pPager->dbFileVers[0xf] == cStack_39);
        if (((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                     (ushort)(auVar10[0xf] >> 7) << 0xf) != 0xffff) &&
           (pager_reset(pPager), pPager->bUseFetch != '\0')) {
          (*pPager->fd->pMethods->xUnfetch)(pPager->fd,0,(void *)0x0);
        }
        iVar5 = iVar7;
        if (pPager->tempFile != '\0') goto LAB_00139dcd;
        goto LAB_0013a174;
      }
      if (iVar5 == 0x20a) {
        _exists = (undefined1  [16])0x0;
        goto LAB_0013a132;
      }
      goto LAB_00139df7;
    }
  }
  else {
LAB_00139d66:
    locked = 0;
    sqlite3WalEndReadTransaction(pWVar8);
    pWVar8 = pPager->pWal;
    auVar4._12_4_ = 0;
    auVar4._0_12_ = _auStack_44;
    _exists = auVar4 << 0x20;
    do {
      iVar5 = walTryBeginRead(pWVar8,&locked,0,&exists);
    } while (iVar5 == -1);
    if ((locked != 0 || iVar5 != 0) && (pager_reset(pPager), pPager->bUseFetch != '\0')) {
      (*pPager->fd->pMethods->xUnfetch)(pPager->fd,0,(void *)0x0);
    }
LAB_00139dd9:
    if (((pPager->tempFile == '\0') && (pPager->eState == '\0')) && (iVar5 == 0)) {
      iVar5 = pagerPagecount(pPager,&pPager->dbSize);
    }
LAB_00139df7:
    if (iVar5 == 0) {
      pPager->eState = '\x01';
      pPager->hasHeldSharedLock = '\x01';
      iVar5 = 0;
      goto LAB_00139e13;
    }
  }
LAB_00139dfe:
  pager_unlock(pPager);
LAB_00139e13:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar5;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerSharedLock(Pager *pPager){
  int rc = SQLITE_OK;                /* Return code */

  /* This routine is only called from b-tree and only when there are no
  ** outstanding pages. This implies that the pager state should either
  ** be OPEN or READER. READER is only possible if the pager is or was in
  ** exclusive access mode.  */
  assert( sqlite3PcacheRefCount(pPager->pPCache)==0 );
  assert( assert_pager_state(pPager) );
  assert( pPager->eState==PAGER_OPEN || pPager->eState==PAGER_READER );
  assert( pPager->errCode==SQLITE_OK );

  if( !pagerUseWal(pPager) && pPager->eState==PAGER_OPEN ){
    int bHotJournal = 1;          /* True if there exists a hot journal-file */

    assert( !MEMDB );
    assert( pPager->tempFile==0 || pPager->eLock==EXCLUSIVE_LOCK );

    rc = pager_wait_on_lock(pPager, SHARED_LOCK);
    if( rc!=SQLITE_OK ){
      assert( pPager->eLock==NO_LOCK || pPager->eLock==UNKNOWN_LOCK );
      goto failed;
    }

    /* If a journal file exists, and there is no RESERVED lock on the
    ** database file, then it either needs to be played back or deleted.
    */
    if( pPager->eLock<=SHARED_LOCK ){
      rc = hasHotJournal(pPager, &bHotJournal);
    }
    if( rc!=SQLITE_OK ){
      goto failed;
    }
    if( bHotJournal ){
      if( pPager->readOnly ){
        rc = SQLITE_READONLY_ROLLBACK;
        goto failed;
      }

      /* Get an EXCLUSIVE lock on the database file. At this point it is
      ** important that a RESERVED lock is not obtained on the way to the
      ** EXCLUSIVE lock. If it were, another process might open the
      ** database file, detect the RESERVED lock, and conclude that the
      ** database is safe to read while this process is still rolling the
      ** hot-journal back.
      **
      ** Because the intermediate RESERVED lock is not requested, any
      ** other process attempting to access the database file will get to
      ** this point in the code and fail to obtain its own EXCLUSIVE lock
      ** on the database file.
      **
      ** Unless the pager is in locking_mode=exclusive mode, the lock is
      ** downgraded to SHARED_LOCK before this function returns.
      */
      rc = pagerLockDb(pPager, EXCLUSIVE_LOCK);
      if( rc!=SQLITE_OK ){
        goto failed;
      }

      /* If it is not already open and the file exists on disk, open the
      ** journal for read/write access. Write access is required because
      ** in exclusive-access mode the file descriptor will be kept open
      ** and possibly used for a transaction later on. Also, write-access
      ** is usually required to finalize the journal in journal_mode=persist
      ** mode (and also for journal_mode=truncate on some systems).
      **
      ** If the journal does not exist, it usually means that some
      ** other connection managed to get in and roll it back before
      ** this connection obtained the exclusive lock above. Or, it
      ** may mean that the pager was in the error-state when this
      ** function was called and the journal file does not exist.
      */
      if( !isOpen(pPager->jfd) && pPager->journalMode!=PAGER_JOURNALMODE_OFF ){
        sqlite3_vfs * const pVfs = pPager->pVfs;
        int bExists;              /* True if journal file exists */
        rc = sqlite3OsAccess(
            pVfs, pPager->zJournal, SQLITE_ACCESS_EXISTS, &bExists);
        if( rc==SQLITE_OK && bExists ){
          int fout = 0;
          int f = SQLITE_OPEN_READWRITE|SQLITE_OPEN_MAIN_JOURNAL;
          assert( !pPager->tempFile );
          rc = sqlite3OsOpen(pVfs, pPager->zJournal, pPager->jfd, f, &fout);
          assert( rc!=SQLITE_OK || isOpen(pPager->jfd) );
          if( rc==SQLITE_OK && fout&SQLITE_OPEN_READONLY ){
            rc = SQLITE_CANTOPEN_BKPT;
            sqlite3OsClose(pPager->jfd);
          }
        }
      }

      /* Playback and delete the journal.  Drop the database write
      ** lock and reacquire the read lock. Purge the cache before
      ** playing back the hot-journal so that we don't end up with
      ** an inconsistent cache.  Sync the hot journal before playing
      ** it back since the process that crashed and left the hot journal
      ** probably did not sync it and we are required to always sync
      ** the journal before playing it back.
      */
      if( isOpen(pPager->jfd) ){
        assert( rc==SQLITE_OK );
        rc = pagerSyncHotJournal(pPager);
        if( rc==SQLITE_OK ){
          rc = pager_playback(pPager, !pPager->tempFile);
          pPager->eState = PAGER_OPEN;
        }
      }else if( !pPager->exclusiveMode ){
        pagerUnlockDb(pPager, SHARED_LOCK);
      }

      if( rc!=SQLITE_OK ){
        /* This branch is taken if an error occurs while trying to open
        ** or roll back a hot-journal while holding an EXCLUSIVE lock. The
        ** pager_unlock() routine will be called before returning to unlock
        ** the file. If the unlock attempt fails, then Pager.eLock must be
        ** set to UNKNOWN_LOCK (see the comment above the #define for
        ** UNKNOWN_LOCK above for an explanation).
        **
        ** In order to get pager_unlock() to do this, set Pager.eState to
        ** PAGER_ERROR now. This is not actually counted as a transition
        ** to ERROR state in the state diagram at the top of this file,
        ** since we know that the same call to pager_unlock() will very
        ** shortly transition the pager object to the OPEN state. Calling
        ** assert_pager_state() would fail now, as it should not be possible
        ** to be in ERROR state when there are zero outstanding page
        ** references.
        */
        pager_error(pPager, rc);
        goto failed;
      }

      assert( pPager->eState==PAGER_OPEN );
      assert( (pPager->eLock==SHARED_LOCK)
           || (pPager->exclusiveMode && pPager->eLock>SHARED_LOCK)
      );
    }

    if( !pPager->tempFile && pPager->hasHeldSharedLock ){
      /* The shared-lock has just been acquired then check to
      ** see if the database has been modified.  If the database has changed,
      ** flush the cache.  The hasHeldSharedLock flag prevents this from
      ** occurring on the very first access to a file, in order to save a
      ** single unnecessary sqlite3OsRead() call at the start-up.
      **
      ** Database changes are detected by looking at 15 bytes beginning
      ** at offset 24 into the file.  The first 4 of these 16 bytes are
      ** a 32-bit counter that is incremented with each change.  The
      ** other bytes change randomly with each file change when
      ** a codec is in use.
      **
      ** There is a vanishingly small chance that a change will not be
      ** detected.  The chance of an undetected change is so small that
      ** it can be neglected.
      */
      char dbFileVers[sizeof(pPager->dbFileVers)];

      IOTRACE(("CKVERS %p %d\n", pPager, sizeof(dbFileVers)));
      rc = sqlite3OsRead(pPager->fd, &dbFileVers, sizeof(dbFileVers), 24);
      if( rc!=SQLITE_OK ){
        if( rc!=SQLITE_IOERR_SHORT_READ ){
          goto failed;
        }
        memset(dbFileVers, 0, sizeof(dbFileVers));
      }

      if( memcmp(pPager->dbFileVers, dbFileVers, sizeof(dbFileVers))!=0 ){
        pager_reset(pPager);

        /* Unmap the database file. It is possible that external processes
        ** may have truncated the database file and then extended it back
        ** to its original size while this process was not holding a lock.
        ** In this case there may exist a Pager.pMap mapping that appears
        ** to be the right size but is not actually valid. Avoid this
        ** possibility by unmapping the db here. */
        if( USEFETCH(pPager) ){
          sqlite3OsUnfetch(pPager->fd, 0, 0);
        }
      }
    }

    /* If there is a WAL file in the file-system, open this database in WAL
    ** mode. Otherwise, the following function call is a no-op.
    */
    rc = pagerOpenWalIfPresent(pPager);
#ifndef SQLITE_OMIT_WAL
    assert( pPager->pWal==0 || rc==SQLITE_OK );
#endif
  }

  if( pagerUseWal(pPager) ){
    assert( rc==SQLITE_OK );
    rc = pagerBeginReadTransaction(pPager);
  }

  if( pPager->tempFile==0 && pPager->eState==PAGER_OPEN && rc==SQLITE_OK ){
    rc = pagerPagecount(pPager, &pPager->dbSize);
  }

 failed:
  if( rc!=SQLITE_OK ){
    assert( !MEMDB );
    pager_unlock(pPager);
    assert( pPager->eState==PAGER_OPEN );
  }else{
    pPager->eState = PAGER_READER;
    pPager->hasHeldSharedLock = 1;
  }
  return rc;
}